

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bundle.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Bundle::AddPDU(Bundle *this,KDataStream *K)

{
  KUINT16 KVar1;
  ushort uVar2;
  KException *this_00;
  KString local_40;
  
  std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>::push_back(&this->m_vStreams,K)
  ;
  KVar1 = KDataStream::GetBufferSize(K);
  uVar2 = KVar1 + this->m_ui16Length;
  this->m_ui16Length = uVar2;
  if (uVar2 < 0x2001) {
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"AddPDU","");
  KException::KException(this_00,&local_40,0xb);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Bundle::AddPDU(const KDataStream &K) noexcept(false)
{
    m_vStreams.push_back( K );
    m_ui16Length += K.GetBufferSize();
    if( m_ui16Length > MAX_PDU_SIZE )throw KException( __FUNCTION__, PDU_TOO_LARGE );
}